

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O0

BinaryenExpressionRef
BinaryenStringSliceIter
          (BinaryenModuleRef module,BinaryenExpressionRef ref,BinaryenExpressionRef num)

{
  StringSliceIter *pSVar1;
  Builder local_28;
  Expression *local_20;
  BinaryenExpressionRef num_local;
  BinaryenExpressionRef ref_local;
  BinaryenModuleRef module_local;
  
  local_20 = num;
  num_local = ref;
  ref_local = (BinaryenExpressionRef)module;
  wasm::Builder::Builder(&local_28,module);
  pSVar1 = wasm::Builder::makeStringSliceIter(&local_28,num_local,local_20);
  return (BinaryenExpressionRef)pSVar1;
}

Assistant:

BinaryenExpressionRef BinaryenStringSliceIter(BinaryenModuleRef module,
                                              BinaryenExpressionRef ref,
                                              BinaryenExpressionRef num) {
  return static_cast<Expression*>(
    Builder(*(Module*)module)
      .makeStringSliceIter((Expression*)ref, (Expression*)num));
}